

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O3

Ray * __thiscall
pbrt::Interaction::SpawnRayTo(Ray *__return_storage_ptr__,Interaction *this,Point3f *p2)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Point3fi pi;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  MediumHandle *pMVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector3f d;
  
  auVar10._0_4_ =
       (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar10._4_4_ =
       (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar10._8_4_ =
       (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar10._12_4_ =
       (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar3 = (p2->super_Tuple3<pbrt::Point3,_float>).x;
  uVar4 = (p2->super_Tuple3<pbrt::Point3,_float>).y;
  auVar10 = vhaddps_avx(auVar10,auVar10);
  auVar11._8_4_ = 0xbf000000;
  auVar11._0_8_ = 0xbf000000bf000000;
  auVar11._12_4_ = 0xbf000000;
  auVar10 = vmulps_avx512vl(auVar10,auVar11);
  uVar5 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  uVar6 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar6;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)uVar5;
  uVar7 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  uVar8 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = (Float)uVar8;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = (Float)uVar7;
  d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar3 + auVar10._0_4_;
  d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4 + auVar10._4_4_;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  d.super_Tuple3<pbrt::Vector3,_float>.z =
       ((this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
       -0.5 + (p2->super_Tuple3<pbrt::Point3,_float>).z;
  pbrt::SpawnRay(__return_storage_ptr__,pi,(Normal3f)(this->n).super_Tuple3<pbrt::Normal3,_float>,
                 this->time,d);
  if (this->mediumInterface == (MediumInterface *)0x0) {
    pMVar9 = &this->medium;
  }
  else {
    fVar1 = (this->n).super_Tuple3<pbrt::Normal3,_float>.z;
    fVar2 = (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11 = ZEXT416((uint)(fVar1 * fVar2));
    auVar10 = vfmadd132ss_fma(ZEXT416((uint)(this->n).super_Tuple3<pbrt::Normal3,_float>.y),auVar11,
                              ZEXT416((uint)(__return_storage_ptr__->d).
                                            super_Tuple3<pbrt::Vector3,_float>.y));
    auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar11);
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ + auVar11._0_4_)),
                              ZEXT416((uint)(this->n).super_Tuple3<pbrt::Normal3,_float>.x),
                              ZEXT416((uint)(__return_storage_ptr__->d).
                                            super_Tuple3<pbrt::Vector3,_float>.x));
    pMVar9 = &this->mediumInterface->inside + (0.0 < auVar10._0_4_);
  }
  (__return_storage_ptr__->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (pMVar9->
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          ).bits;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    Ray SpawnRayTo(const Point3f &p2) const {
        Ray r = pbrt::SpawnRayTo(pi, n, time, p2);
        r.medium = GetMedium(r.d);
        return r;
    }